

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Detail::rawMemoryToString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,void *object,size_t size)

{
  long lVar1;
  bool bVar2;
  long local_1a0;
  ostringstream os;
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"0x",2);
  lVar1 = *(long *)(local_1a0 + -0x18);
  if (acStack_c0[lVar1 + 1] == '\0') {
    std::ios::widen((char)&local_1a0 + (char)lVar1);
    acStack_c0[lVar1 + 1] = '\x01';
  }
  acStack_c0[lVar1] = '0';
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xffffffb5 | 8;
  lVar1 = (long)(int)object;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0 + -0x18)) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size )
    {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        std::ostringstream os;
        os << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             os << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return os.str();
    }